

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O0

MPP_RET mpp_enc_ref_cfg_deinit(MppEncRefCfg *ref)

{
  void *ptr;
  MPP_RET MVar1;
  MppEncRefCfgImpl *p;
  MppEncRefCfg *ref_local;
  
  if ((ref != (MppEncRefCfg *)0x0) &&
     (MVar1 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_deinit",*ref), MVar1 == MPP_OK)) {
    ptr = *ref;
    if (*(long *)((long)ptr + 0x28) != 0) {
      mpp_osal_free("mpp_enc_ref_cfg_deinit",*(void **)((long)ptr + 0x28));
    }
    *(undefined8 *)((long)ptr + 0x28) = 0;
    if (*(long *)((long)ptr + 0x30) != 0) {
      mpp_osal_free("mpp_enc_ref_cfg_deinit",*(void **)((long)ptr + 0x30));
    }
    *(undefined8 *)((long)ptr + 0x30) = 0;
    if (ptr != (void *)0x0) {
      mpp_osal_free("mpp_enc_ref_cfg_deinit",ptr);
    }
    return MPP_OK;
  }
  _mpp_log_l(2,"mpp_enc_ref","input %p check failed\n","mpp_enc_ref_cfg_deinit",ref);
  return MPP_ERR_VALUE;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_deinit(MppEncRefCfg *ref)
{
    if (!ref || check_is_mpp_enc_ref_cfg(*ref)) {
        mpp_err_f("input %p check failed\n", ref);
        return MPP_ERR_VALUE;
    }

    MppEncRefCfgImpl *p = (MppEncRefCfgImpl *)(*ref);
    MPP_FREE(p->lt_cfg);
    MPP_FREE(p->st_cfg);
    MPP_FREE(p);

    return MPP_OK;
}